

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginTooltipEx(ImGuiWindowFlags extra_flags,bool override_previous_tooltip)

{
  ImGuiContext *pIVar1;
  ImU32 key;
  void *pvVar2;
  undefined7 in_register_00000031;
  ImGuiStorage *this;
  char window_name [16];
  char acStack_38 [24];
  
  pIVar1 = GImGui;
  ImFormatString(acStack_38,0x10,"##Tooltip_%02d",(ulong)(uint)GImGui->TooltipOverrideCount);
  if ((int)CONCAT71(in_register_00000031,override_previous_tooltip) != 0) {
    this = &GImGui->WindowsById;
    key = ImHash(acStack_38,0,0);
    pvVar2 = ImGuiStorage::GetVoidPtr(this,key);
    if ((pvVar2 != (void *)0x0) && (*(char *)((long)pvVar2 + 0x7a) == '\x01')) {
      *(undefined4 *)((long)pvVar2 + 0xa8) = 1;
      pIVar1->TooltipOverrideCount = pIVar1->TooltipOverrideCount + 1;
      ImFormatString(acStack_38,0x10,"##Tooltip_%02d");
    }
  }
  Begin(acStack_38,(bool *)0x0,extra_flags | 0x20c0347);
  return;
}

Assistant:

void ImGui::BeginTooltipEx(ImGuiWindowFlags extra_flags, bool override_previous_tooltip)
{
    ImGuiContext& g = *GImGui;
    char window_name[16];
    ImFormatString(window_name, IM_ARRAYSIZE(window_name), "##Tooltip_%02d", g.TooltipOverrideCount);
    if (override_previous_tooltip)
        if (ImGuiWindow* window = FindWindowByName(window_name))
            if (window->Active)
            {
                // Hide previous tooltip from being displayed. We can't easily "reset" the content of a window so we create a new one.
                window->HiddenFrames = 1;
                ImFormatString(window_name, IM_ARRAYSIZE(window_name), "##Tooltip_%02d", ++g.TooltipOverrideCount);
            }
    ImGuiWindowFlags flags = ImGuiWindowFlags_Tooltip|ImGuiWindowFlags_NoInputs|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoMove|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoNav;
    Begin(window_name, NULL, flags | extra_flags);
}